

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectExpressions.cpp
# Opt level: O2

void __thiscall
slang::ast::RecursiveStructMemberIterator::prepNext(RecursiveStructMemberIterator *this)

{
  size_type sVar1;
  pointer pSVar2;
  FieldSymbol **ppFVar3;
  bool bVar4;
  Type *pTVar5;
  Type *pTVar6;
  ConstantValue *pCVar7;
  size_t sVar8;
  SyntaxNode *pSVar9;
  
  pSVar9 = (SyntaxNode *)(this->curr).fieldIt._M_current;
  do {
    if (pSVar9 == (SyntaxNode *)(this->curr).fieldEnd._M_current) {
      sVar1 = (this->stack).super_SmallVectorBase<slang::ast::RecursiveStructMemberIterator::State>.
              len;
      if (sVar1 == 0) {
        (this->curr).type = (Type *)0x0;
        return;
      }
      pSVar2 = (this->stack).super_SmallVectorBase<slang::ast::RecursiveStructMemberIterator::State>
               .data_;
      pCVar7 = pSVar2[sVar1 - 1].val;
      pTVar5 = pSVar2[sVar1 - 1].type;
      ppFVar3 = ((FieldIt *)(&pSVar2[sVar1 - 1].valIndex + 1))->_M_current;
      (this->curr).valIndex = pSVar2[sVar1 - 1].valIndex;
      (this->curr).fieldIt._M_current = ppFVar3;
      (this->curr).val = pCVar7;
      (this->curr).type = pTVar5;
      (this->curr).fieldEnd._M_current = pSVar2[sVar1 - 1].fieldEnd._M_current;
      (this->stack).super_SmallVectorBase<slang::ast::RecursiveStructMemberIterator::State>.len =
           sVar1 - 1;
      sVar8 = (this->curr).valIndex;
      pSVar9 = (SyntaxNode *)((this->curr).fieldIt._M_current + 1);
      (this->curr).fieldIt._M_current = (FieldSymbol **)pSVar9;
      sVar8 = sVar8 + 1;
    }
    else {
      pTVar5 = DeclaredType::getType((DeclaredType *)(*(long *)pSVar9 + 0x40));
      bVar4 = Type::isUnpackedStruct(pTVar5);
      if (!bVar4) {
        return;
      }
      SmallVectorBase<slang::ast::RecursiveStructMemberIterator::State>::
      emplace_back<slang::ast::RecursiveStructMemberIterator::State&>
                (&(this->stack).
                  super_SmallVectorBase<slang::ast::RecursiveStructMemberIterator::State>,
                 &this->curr);
      pTVar6 = Type::getCanonicalType(pTVar5);
      pSVar9 = pTVar6[1].super_Symbol.originatingSyntax;
      pTVar6 = pTVar6[1].canonical;
      (this->curr).type = pTVar5;
      pCVar7 = ConstantValue::at((this->curr).val,(this->curr).valIndex);
      (this->curr).val = pCVar7;
      (this->curr).fieldIt._M_current = (FieldSymbol **)pSVar9;
      (this->curr).fieldEnd._M_current = (FieldSymbol **)(&pSVar9->kind + (long)pTVar6 * 2);
      sVar8 = 0;
    }
    (this->curr).valIndex = sVar8;
  } while( true );
}

Assistant:

void prepNext() {
        if (curr.fieldIt == curr.fieldEnd) {
            if (stack.empty()) {
                curr.type = nullptr;
                return;
            }

            curr = stack.back();
            stack.pop_back();

            curr.next();
            prepNext();
        }
        else {
            auto& type = (*curr.fieldIt)->getType();
            if (type.isUnpackedStruct()) {
                stack.emplace_back(curr);

                auto fields = type.getCanonicalType().as<UnpackedStructType>().fields;
                curr.type = &type;
                curr.val = &curr.val->at(curr.valIndex);
                curr.fieldIt = fields.begin();
                curr.fieldEnd = fields.end();
                curr.valIndex = 0;
                prepNext();
            }
        }
    }